

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arbitrary.cpp
# Opt level: O2

bool __thiscall Arbitrarylist::Run(Arbitrarylist *this)

{
  bool bVar1;
  vector<std::__cxx11::list<int,_std::allocator<int>_>,_std::allocator<std::__cxx11::list<int,_std::allocator<int>_>_>_>
  vv;
  list<int,_std::allocator<int>_> v;
  
  testinator::Arbitrary<std::__cxx11::list<int,_std::allocator<int>_>_>::generate(&v,1,0);
  testinator::Arbitrary<std::__cxx11::list<int,_std::allocator<int>_>_>::shrink(&vv,&v);
  if ((long)vv.
            super__Vector_base<std::__cxx11::list<int,_std::allocator<int>_>,_std::allocator<std::__cxx11::list<int,_std::allocator<int>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish -
      (long)vv.
            super__Vector_base<std::__cxx11::list<int,_std::allocator<int>_>,_std::allocator<std::__cxx11::list<int,_std::allocator<int>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start == 0x30) {
    bVar1 = vv.
            super__Vector_base<std::__cxx11::list<int,_std::allocator<int>_>,_std::allocator<std::__cxx11::list<int,_std::allocator<int>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start[1].super__List_base<int,_std::allocator<int>_>
            ._M_impl._M_node._M_size +
            ((vv.
              super__Vector_base<std::__cxx11::list<int,_std::allocator<int>_>,_std::allocator<std::__cxx11::list<int,_std::allocator<int>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start)->
            super__List_base<int,_std::allocator<int>_>)._M_impl._M_node._M_size ==
            v.super__List_base<int,_std::allocator<int>_>._M_impl._M_node._M_size;
  }
  else {
    bVar1 = false;
  }
  std::
  vector<std::__cxx11::list<int,_std::allocator<int>_>,_std::allocator<std::__cxx11::list<int,_std::allocator<int>_>_>_>
  ::~vector(&vv);
  std::__cxx11::_List_base<int,_std::allocator<int>_>::_M_clear
            (&v.super__List_base<int,_std::allocator<int>_>);
  return bVar1;
}

Assistant:

DEF_TEST(list, Arbitrary)
{
  testinator::Arbitrary<list<int>> a;
  list<int> v = a.generate(1,0);
  vector<list<int>> vv = a.shrink(v);
  return vv.size() == 2
    && vv[0].size() + vv[1].size() == v.size();
}